

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square.hpp
# Opt level: O0

autodiff_fvar<float,_1UL> __thiscall
anon_unknown.dwarf_532d9::func<float>::operator()(func<float> *this,float beta)

{
  root_type *in_RDI;
  undefined4 in_XMM0_Da;
  autodiff_fvar<float,_1UL> aVar1;
  fvar<float,_1UL> fVar2;
  autodiff_fvar<float,_1UL> beta_fvar;
  root_type *in_stack_ffffffffffffff98;
  fvar<float,_1UL> *this_00;
  fvar<float,_1UL> *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffe0;
  float fVar3;
  float fVar4;
  
  aVar1 = boost::math::differentiation::autodiff_v1::make_fvar<float,_1UL>
                    (in_stack_ffffffffffffff98);
  fVar3 = aVar1.v._M_elems[0];
  fVar4 = aVar1.v._M_elems[1];
  this_00 = (fvar<float,_1UL> *)&stack0xffffffffffffffe4;
  boost::math::differentiation::autodiff_v1::detail::operator*
            (in_stack_ffffffffffffff98,(fvar<float,_1UL> *)0x108330);
  boost::math::differentiation::autodiff_v1::detail::sinh<float,1ul>(in_stack_ffffffffffffffb8);
  fVar2 = boost::math::differentiation::autodiff_v1::detail::operator*
                    (in_stack_ffffffffffffff98,(fvar<float,_1UL> *)0x108369);
  boost::math::differentiation::autodiff_v1::detail::sinh<float,1ul>
            ((fvar<float,_1UL> *)fVar2.v._M_elems);
  boost::math::differentiation::autodiff_v1::detail::fvar<float,1ul>::operator*
            ((fvar<float,_1UL> *)CONCAT44(in_XMM0_Da,fVar4),
             (fvar<float,_1UL> *)CONCAT44(fVar3,in_stack_ffffffffffffffe0));
  fVar2 = boost::math::differentiation::autodiff_v1::detail::fvar<float,_1UL>::operator-
                    (this_00,in_RDI);
  return (autodiff_fvar<float,_1UL>)fVar2.v._M_elems._M_elems;
}

Assistant:

auto operator()(T beta) const -> decltype(boost::math::differentiation::make_fvar<T, 1>(beta)) {
    using std::sinh;
    auto beta_fvar = boost::math::differentiation::make_fvar<T, 1>(beta);
    return sinh(2 * Jx_ * beta_fvar) * sinh(2 * Jy_ * beta_fvar) - 1;
  }